

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>::findImpl<QWidget_const*>
          (QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>> *this,QWidget **key)

{
  Data<QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>> *this_00;
  Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_> *pDVar1;
  ulong uVar2;
  Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_> *pDVar3;
  Bucket BVar4;
  iterator iVar5;
  
  this_00 = *(Data<QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>> **)
             this;
  if ((this_00 ==
       (Data<QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>> *)0x0) ||
     (*(long *)(this_00 + 8) == 0)) {
    pDVar1 = (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_> *
             )0x0;
    pDVar3 = (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_> *
             )0x0;
  }
  else {
    uVar2 = ((*(ulong *)(this_00 + 0x18) ^ (ulong)*key) >> 0x20 ^
            *(ulong *)(this_00 + 0x18) ^ (ulong)*key) * -0x2917014799a6026d;
    uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
    BVar4 = QHashPrivate::
            Data<QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>>::
            findBucketWithHash<QWidget_const*>(this_00,key,uVar2 >> 0x20 ^ uVar2);
    pDVar1 = *(Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_>
               **)this;
    pDVar3 = (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_> *
             )(((ulong)((long)BVar4.span - (long)pDVar1->spans) >> 4) * 0x1c71c71c71c71c80 |
              BVar4.index);
    if ((pDVar1 == (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_>
                    *)0x0) ||
       (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar1 = QHashPrivate::
               Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_>
               ::detached(pDVar1);
      *(Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_> **)this
           = pDVar1;
    }
    pDVar1 = *(Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_>
               **)this;
    if ((*(Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_> **)
          this)->spans[(ulong)pDVar3 >> 7].offsets[(uint)BVar4.index & 0x7f] == 0xff) {
      pDVar1 = (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_>
                *)0x0;
      pDVar3 = (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_>
                *)0x0;
    }
  }
  iVar5.i.bucket = (size_t)pDVar3;
  iVar5.i.d = pDVar1;
  return (iterator)iVar5.i;
}

Assistant:

iterator findImpl(const K &key)
    {
        if (isEmpty()) // prevents detaching shared null
            return end();
        auto it = d->findBucket(key);
        size_t bucket = it.toBucketIndex(d);
        detach();
        it = typename Data::Bucket(d, bucket); // reattach in case of detach
        if (it.isUnused())
            return end();
        return iterator(it.toIterator(d));
    }